

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::initDynamicTestLists(Builder builder)

{
  Builder builder_00;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  memcpy(&stack0xffffffffffffffc8,&stack0x00000008,0x30);
  builder_00.builder.segment = (SegmentBuilder *)local_28;
  builder_00.schema.super_Schema.raw = (Schema)(Schema)uStack_30;
  builder_00.builder.capTable = (CapTableBuilder *)uStack_20;
  builder_00.builder.data = (void *)local_18;
  builder_00.builder.pointers = (WirePointer *)uStack_10;
  builder_00.builder.dataSize = (int)in_stack_ffffffffffffffc8;
  builder_00.builder.pointerCount = (short)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  builder_00.builder._38_2_ = (short)((ulong)in_stack_ffffffffffffffc8 >> 0x30);
  anon_unknown_134::dynamicInitListDefaults(builder_00);
  return;
}

Assistant:

void initDynamicTestLists(DynamicStruct::Builder builder) {
  dynamicInitListDefaults(builder);
}